

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menudef.cpp
# Opt level: O1

void SkipSubBlock(FScanner *sc)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  
  FScanner::MustGetStringName(sc,"{");
  iVar3 = 1;
  do {
    FScanner::MustGetString(sc);
    bVar1 = FScanner::Compare(sc,"{");
    bVar2 = FScanner::Compare(sc,"}");
    iVar3 = ((uint)bVar1 + iVar3) - (uint)bVar2;
  } while (0 < iVar3);
  return;
}

Assistant:

static void SkipSubBlock(FScanner &sc)
{
	sc.MustGetStringName("{");
	int depth = 1;
	while (depth > 0)
	{
		sc.MustGetString();
		if (sc.Compare("{")) depth++;
		if (sc.Compare("}")) depth--;
	}
}